

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

bool isItAFunction<CyclicHash<unsigned_long_long,unsigned_char>>(uint L)

{
  bool bVar1;
  uint32_conflict uVar2;
  reference pvVar3;
  _Map_pointer ppuVar4;
  reference puVar5;
  ostream *poVar6;
  unsigned_long_long uVar7;
  void *pvVar8;
  byte *pbVar9;
  uint local_1c8c;
  undefined1 local_1c88 [4];
  uint j;
  undefined1 local_1c68 [8];
  iterator ii;
  uint local_1c40;
  char c_1;
  uchar out;
  uint32_conflict k_1;
  uchar local_1c2d;
  uint local_1c2c;
  undefined1 local_1c28 [3];
  uchar c;
  uint32_conflict k;
  deque<unsigned_char,_std::allocator<unsigned_char>_> s;
  CyclicHash<unsigned_long_long,_unsigned_char> hf;
  undefined1 local_13a8 [4];
  uint n;
  mersenneRNG generator;
  uint L_local;
  
  generator.n = L;
  mersenneRNG::mersenneRNG((mersenneRNG *)local_13a8,5);
  hf.maskn._4_4_ = 3;
  CyclicHash<unsigned_long_long,_unsigned_char>::CyclicHash
            ((CyclicHash<unsigned_long_long,_unsigned_char> *)
             &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node,3,generator.n);
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::deque
            ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c28);
  for (local_1c2c = 0; local_1c2c < 3; local_1c2c = local_1c2c + 1) {
    uVar2 = mersenneRNG::operator()((mersenneRNG *)local_13a8);
    local_1c2d = (char)uVar2 + 'A';
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c28,&local_1c2d);
    CyclicHash<unsigned_long_long,_unsigned_char>::eat
              ((CyclicHash<unsigned_long_long,_unsigned_char> *)
               &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node,local_1c2d);
  }
  local_1c40 = 0;
  do {
    if (99999 < local_1c40) {
      generator._5015_1_ = 1;
LAB_0010653e:
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::~deque
                ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c28);
      return (bool)(generator._5015_1_ & 1);
    }
    pvVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::front
                       ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c28);
    ii._M_node._7_1_ = *pvVar3;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front
              ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c28);
    uVar2 = mersenneRNG::operator()((mersenneRNG *)local_13a8);
    ii._M_node._5_1_ = (char)uVar2 + 'A';
    ii._M_node._6_1_ = ii._M_node._5_1_;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c28,
               (value_type *)((long)&ii._M_node + 5));
    CyclicHash<unsigned_long_long,_unsigned_char>::update
              ((CyclicHash<unsigned_long_long,_unsigned_char> *)
               &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node,ii._M_node._7_1_,ii._M_node._6_1_);
    ppuVar4 = (_Map_pointer)
              CyclicHash<unsigned_long_long,unsigned_char>::
              hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
                        ((CyclicHash<unsigned_long_long,unsigned_char> *)
                         &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                          .super__Deque_impl_data._M_finish._M_node,
                         (deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c28);
    if (ppuVar4 !=
        s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Deque_impl_data._M_finish._M_node) {
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((iterator *)local_1c68,
                 (deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c28);
      while( true ) {
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((iterator *)local_1c88,
                   (deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c28);
        bVar1 = std::operator!=((_Self *)local_1c68,(_Self *)local_1c88);
        if (!bVar1) break;
        puVar5 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator*
                           ((_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)
                            local_1c68);
        poVar6 = std::operator<<((ostream *)&std::cout,*puVar5);
        poVar6 = std::operator<<(poVar6," ");
        pbVar9 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator*
                           ((_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)
                            local_1c68);
        pvVar8 = (void *)std::ostream::operator<<(poVar6,(uint)*pbVar9);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator++
                  ((_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)local_1c68);
      }
      poVar6 = std::operator<<((ostream *)&std::cerr,"bug");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pvVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c28,0);
      poVar6 = std::operator<<((ostream *)&std::cerr,*pvVar3);
      pvVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c28,1);
      poVar6 = std::operator<<(poVar6,*pvVar3);
      pvVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c28,2);
      poVar6 = std::operator<<(poVar6,*pvVar3);
      poVar6 = std::operator<<(poVar6," was hashed to ");
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,(ulonglong)
                                 s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Deque_impl_data._M_finish._M_node);
      poVar6 = std::operator<<(poVar6," when true hash value is ");
      uVar7 = CyclicHash<unsigned_long_long,unsigned_char>::
              hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
                        ((CyclicHash<unsigned_long_long,unsigned_char> *)
                         &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                          .super__Deque_impl_data._M_finish._M_node,
                         (deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c28);
      pvVar8 = (void *)std::ostream::operator<<(poVar6,uVar7);
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      for (local_1c8c = 0; local_1c8c < 3; local_1c8c = local_1c8c + 1) {
        pvVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c28,
                            (ulong)local_1c8c);
        poVar6 = std::operator<<((ostream *)&std::cerr,*pvVar3);
        poVar6 = std::operator<<(poVar6,"->");
        pbVar9 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c28,
                            (ulong)local_1c8c);
        pvVar8 = (void *)std::ostream::operator<<(poVar6,hf.hasher.hashvalues[(ulong)*pbVar9 - 1]);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      }
      generator._5015_1_ = 0;
      goto LAB_0010653e;
    }
    local_1c40 = local_1c40 + 1;
  } while( true );
}

Assistant:

bool isItAFunction(uint L = 7) {
  mersenneRNG generator(5);
  const uint n(3); // n-grams
  hashfunction hf(n, L);
  deque<unsigned char> s;
  for (uint32 k = 0; k < n; ++k) {
    unsigned char c = static_cast<unsigned char>(generator() + 65);
    s.push_back(c);
    hf.eat(c);
  }
  for (uint32 k = 0; k < 100000; ++k) {
    unsigned char out = s.front();
    s.pop_front();
    char c(generator() + 65);

    s.push_back(c);
    hf.update(out, c);
    if (hf.hash(s) != hf.hashvalue) {
      for (deque<unsigned char>::iterator ii = s.begin(); ii != s.end(); ++ii)
        cout << *ii << " " << static_cast<uint32>(*ii) << endl;
      cerr << "bug" << endl;
      cerr << s[0] << s[1] << s[2] << " was hashed to " << hf.hashvalue
           << " when true hash value is " << hf.hash(s) << endl;
      for (uint j = 0; j < n; ++j)
        cerr << s[j] << "->" << hf.hasher.hashvalues[s[j]] << endl;
      return false;
    }
  }
  return true;
}